

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O2

int32_t trng::int_math::modulo_helper<2147483647,_2>::modulo(uint64_t x)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (x >> 0x1f) + (x & 0x7fffffff);
  uVar2 = uVar3 - 0x1fffffffc;
  if ((uint)(uVar3 >> 2) < 0x7fffffff) {
    uVar2 = uVar3;
  }
  uVar3 = uVar2 - 0xfffffffe;
  if (uVar2 < 0xfffffffe) {
    uVar3 = uVar2;
  }
  iVar1 = (int)uVar3 + -0x7fffffff;
  if (uVar3 < 0x7fffffff) {
    iVar1 = (int)uVar3;
  }
  return iVar1;
}

Assistant:

TRNG_CUDA_ENABLE
      static int32_t modulo(uint64_t x) {
        if (mask == m) {
          uint64_t y{(x & mask) + (x >> e)};
          if (y >= static_cast<uint64_t>(4u) * m)
            y -= static_cast<uint64_t>(4u) * m;
          if (y >= static_cast<uint64_t>(2u) * m)
            y -= static_cast<uint64_t>(2u) * m;
          if (y >= m)
            y -= m;
          return static_cast<int32_t>(y);
        }
        if (static_cast<int64_t>(k) * (static_cast<int64_t>(k) + 2) <= m) {
          x = (x & mask) + (x >> e) * k;
          x = (x & mask) + (x >> e) * k;
          if (x >= static_cast<uint64_t>(4u) * m)
            x -= static_cast<uint64_t>(4u) * m;
          if (x >= static_cast<uint64_t>(2u) * m)
            x -= static_cast<uint64_t>(2u) * m;
          if (x >= m)
            x -= m;
          return static_cast<int32_t>(x);
        }
        return static_cast<int32_t>(x % m);
      }